

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.cpp
# Opt level: O0

ValueInfo * __thiscall ValueInfo::Copy(ValueInfo *this,JitArenaAllocator *allocator)

{
  bool bVar1;
  _IntConstantValueInfo<int,_IntConstantValueInfo,_(ValueStructureKind)1> *this_00;
  IntRangeValueInfo *this_01;
  IntBoundedValueInfo *this_02;
  FloatConstantValueInfo *this_03;
  JsTypeValueInfo *this_04;
  ArrayValueInfo *this_05;
  JitArenaAllocator *allocator_local;
  ValueInfo *this_local;
  
  bVar1 = IsIntConstant(this);
  if (bVar1) {
    this_00 = &AsIntConstant(this)->
               super__IntConstantValueInfo<int,_IntConstantValueInfo,_(ValueStructureKind)1>;
    this_local = (ValueInfo *)
                 _IntConstantValueInfo<int,_IntConstantValueInfo,_(ValueStructureKind)1>::Copy
                           (this_00,allocator);
  }
  else {
    bVar1 = IsIntRange(this);
    if (bVar1) {
      this_01 = AsIntRange(this);
      this_local = &IntRangeValueInfo::Copy(this_01,allocator)->super_ValueInfo;
    }
    else {
      bVar1 = IsIntBounded(this);
      if (bVar1) {
        this_02 = AsIntBounded(this);
        this_local = &IntBoundedValueInfo::Copy(this_02,allocator)->super_ValueInfo;
      }
      else {
        bVar1 = IsFloatConstant(this);
        if (bVar1) {
          this_03 = AsFloatConstant(this);
          this_local = &FloatConstantValueInfo::Copy(this_03,allocator)->super_ValueInfo;
        }
        else {
          bVar1 = IsJsType(this);
          if (bVar1) {
            this_04 = AsJsType(this);
            this_local = &JsTypeValueInfo::Copy(this_04,allocator)->super_ValueInfo;
          }
          else {
            bVar1 = IsArrayValueInfo(this);
            if (bVar1) {
              this_05 = AsArrayValueInfo(this);
              this_local = ArrayValueInfo::Copy(this_05,allocator,true,true,true);
            }
            else {
              this_local = CopyWithGenericStructureKind(this,allocator);
            }
          }
        }
      }
    }
  }
  return this_local;
}

Assistant:

ValueInfo *
ValueInfo::Copy(JitArenaAllocator * allocator)
{
    if (IsIntConstant())
    {
        return AsIntConstant()->Copy(allocator);
    }
    if (IsIntRange())
    {
        return AsIntRange()->Copy(allocator);
    }
    if (IsIntBounded())
    {
        return AsIntBounded()->Copy(allocator);
    }
    if (IsFloatConstant())
    {
        return AsFloatConstant()->Copy(allocator);
    }
    if (IsJsType())
    {
        return AsJsType()->Copy(allocator);
    }
    if (IsArrayValueInfo())
    {
        return AsArrayValueInfo()->Copy(allocator);
    }
    return CopyWithGenericStructureKind(allocator);
}